

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
          (pdqsort_detail *this,
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                end,anon_class_16_2_a9e7a8bd comp,int bad_allowed,bool leftmost)

{
  undefined8 *puVar1;
  double *pdVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  double dVar5;
  int iVar6;
  void *pvVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  pointer ppVar13;
  pointer ppVar14;
  pointer ppVar15;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:106:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:106:11)>
  __comp_00;
  bool bVar16;
  long lVar17;
  ulong uVar18;
  FractionalInteger *pFVar19;
  long lVar20;
  pointer *pppVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  FractionalInteger *pFVar25;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var26;
  ulong uVar27;
  pointer ppVar28;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var29;
  undefined4 in_register_0000008c;
  long lVar30;
  FractionalInteger *pFVar31;
  FractionalInteger *pFVar32;
  FractionalInteger *pFVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double score1;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  anon_class_16_2_a9e7a8bd comp_00;
  anon_class_16_2_a9e7a8bd comp_01;
  anon_class_16_2_a9e7a8bd comp_02;
  anon_class_16_2_a9e7a8bd comp_03;
  anon_class_16_2_a9e7a8bd comp_04;
  anon_class_16_2_a9e7a8bd comp_05;
  anon_class_16_2_a9e7a8bd comp_06;
  anon_class_16_2_a9e7a8bd comp_07;
  _DistanceType __len;
  undefined1 in_stack_fffffffffffffe78;
  FractionalInteger local_168;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_130;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  int local_fc;
  FractionalInteger *local_f8;
  pointer ppStack_f0;
  int local_dc;
  FractionalInteger *local_d8;
  pointer ppStack_d0;
  FractionalInteger *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a0;
  double local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_78;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_70;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_68;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_60;
  FractionalInteger *local_58;
  pointer local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pFVar25 = (FractionalInteger *)CONCAT44(in_register_0000008c,bad_allowed);
  comp_00.edgeWt = (HighsTableauSeparator *)comp.edgeWt;
  local_dc = (int)comp.this;
  uVar27 = (long)begin._M_current - (long)this;
  if ((long)uVar27 < 0x540) {
    if ((char)bad_allowed == '\0') {
LAB_002e8fc1:
      if ((FractionalInteger *)this == begin._M_current) {
        return;
      }
      while (pFVar25 = (FractionalInteger *)this, this = (pdqsort_detail *)(pFVar25 + 1),
            (FractionalInteger *)this != begin._M_current) {
        local_b8 = pFVar25[1].fractionality;
        lVar22 = (long)pFVar25[1].basisIndex;
        dVar46 = (1.0 - pFVar25->fractionality) * pFVar25->fractionality;
        dVar34 = (1.0 - local_b8) * local_b8;
        auVar44._8_8_ = *(undefined8 *)((long)(end._M_current)->fractionality + lVar22 * 8);
        auVar44._0_8_ =
             *(undefined8 *)((long)(end._M_current)->fractionality + (long)pFVar25->basisIndex * 8);
        local_118._8_4_ = SUB84(dVar34,0);
        local_118._0_8_ = dVar46;
        local_118._12_4_ = (int)((ulong)dVar34 >> 0x20);
        auVar38._8_8_ = dVar34;
        auVar38._0_8_ = dVar46;
        auVar36 = divpd(auVar38,auVar44);
        if ((auVar36._0_8_ < auVar36._8_8_) ||
           ((auVar36._0_8_ <= auVar36._8_8_ &&
            (uVar27 = (long)pFVar25->basisIndex + (comp_00.edgeWt)->numTries,
            uVar23 = uVar27 >> 0x20, uVar27 = uVar27 & 0xffffffff,
            uVar18 = (comp_00.edgeWt)->numTries + lVar22, uVar24 = uVar18 & 0xffffffff,
            uVar18 = uVar18 >> 0x20,
            ((uVar27 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
            (uVar23 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <
            ((uVar24 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
            (uVar18 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20))))) {
          uStack_b0 = 0;
          local_128._M_current._4_4_ = (undefined4)((ulong)local_128._M_current >> 0x20);
          local_128._M_current._0_4_ = pFVar25[1].basisIndex;
          local_168.fractionality = pFVar25[1].row_ep_norm2;
          local_168.row_ep_norm2._0_4_ = SUB84(pFVar25[1].score,0);
          local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar25[1].score >> 0x20);
          local_f8 = (FractionalInteger *)
                     pFVar25[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppStack_f0 = pFVar25[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_130._M_current =
               (FractionalInteger *)
               pFVar25[1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          pFVar25[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pFVar25[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pFVar25[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          do {
            pFVar32 = pFVar25;
            dVar46 = pFVar32->fractionality;
            dVar34 = pFVar32->row_ep_norm2;
            uVar4 = *(undefined8 *)((long)&pFVar32->score + 4);
            ppVar13 = (pFVar32->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = (pFVar32->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)((long)&pFVar32[1].row_ep_norm2 + 4) =
                 *(undefined8 *)((long)&pFVar32->row_ep_norm2 + 4);
            *(undefined8 *)((long)&pFVar32[1].score + 4) = uVar4;
            pFVar32[1].fractionality = dVar46;
            pFVar32[1].row_ep_norm2 = dVar34;
            ppVar28 = pFVar32[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pFVar32[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            pFVar32[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            pFVar32[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pFVar32->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pFVar32->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar32->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar32->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (ppVar28 != (pointer)0x0) {
              operator_delete(ppVar28);
            }
            auVar39._0_8_ = (1.0 - pFVar32[-1].fractionality) * pFVar32[-1].fractionality;
            auVar39._8_8_ = local_118._8_8_;
            auVar45._8_8_ = *(undefined8 *)((long)(end._M_current)->fractionality + lVar22 * 8);
            auVar45._0_8_ =
                 *(undefined8 *)
                  ((long)(end._M_current)->fractionality + (long)pFVar32[-1].basisIndex * 8);
            auVar36 = divpd(auVar39,auVar45);
            pFVar25 = pFVar32 + -1;
          } while ((auVar36._0_8_ < auVar36._8_8_) ||
                  ((auVar36._0_8_ <= auVar36._8_8_ &&
                   (uVar27 = (long)pFVar32[-1].basisIndex + (comp_00.edgeWt)->numTries,
                   uVar23 = uVar27 >> 0x20, uVar27 = uVar27 & 0xffffffff,
                   uVar18 = (comp_00.edgeWt)->numTries + lVar22, uVar24 = uVar18 & 0xffffffff,
                   uVar18 = uVar18 >> 0x20,
                   ((uVar27 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
                   (uVar23 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <
                   ((uVar24 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                   (uVar18 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20)))));
          pFVar32->fractionality = local_b8;
          pFVar32->row_ep_norm2 = local_168.fractionality;
          pFVar32->score =
               (double)CONCAT44(local_168.row_ep_norm2._4_4_,local_168.row_ep_norm2._0_4_);
          pFVar32->basisIndex = (int)local_128._M_current;
          ppVar28 = (pFVar32->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (pFVar32->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_f8;
          (pFVar32->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppStack_f0;
          (pFVar32->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_130._M_current;
          if (ppVar28 != (pointer)0x0) {
            operator_delete(ppVar28);
          }
        }
      }
      return;
    }
  }
  else {
    local_b8 = (double)CONCAT44(local_b8._4_4_,bad_allowed);
    local_130._M_current = begin._M_current + -1;
    local_a0._M_current = begin._M_current + -2;
    local_a8._M_current = begin._M_current + -3;
    local_68 = &begin._M_current[-1].row_ep;
    local_70 = &begin._M_current[-2].row_ep;
    local_78 = &begin._M_current[-3].row_ep;
    do {
      local_f8 = (FractionalInteger *)((uVar27 >> 3) / 7);
      uVar18 = (uVar27 >> 3) / 0xe;
      _Var29._M_current = (FractionalInteger *)((long)this + uVar18 * 0x38);
      local_128._M_current = (FractionalInteger *)this;
      local_c0 = (FractionalInteger *)this;
      if (uVar27 < 0x1c01) {
        comp_07.this = (HighsTableauSeparator *)pFVar25;
        comp_07.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)_Var29._M_current,
                   (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    )this,local_130,end,comp_07);
      }
      else {
        comp_03.this = (HighsTableauSeparator *)pFVar25;
        comp_03.edgeWt = (double **)comp_00.edgeWt;
        local_118._0_8_ = uVar18 * 0x38;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (this,_Var29,local_130,end,comp_03);
        local_d8 = (FractionalInteger *)
                   ((long)&((FractionalInteger *)((long)this + -0x38))->fractionality +
                   local_118._0_8_);
        comp_04.this = (HighsTableauSeparator *)pFVar25;
        comp_04.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)((long)this + 0x38),
                   (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    )local_d8,local_a0,end,comp_04);
        local_118._0_8_ =
             (long)&((FractionalInteger *)((long)this + 0x38))->fractionality + local_118._0_8_;
        comp_05.this = (HighsTableauSeparator *)pFVar25;
        comp_05.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)((long)this + 0x70),
                   (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    )local_118._0_8_,local_a8,end,comp_05);
        comp_06.this = (HighsTableauSeparator *)pFVar25;
        comp_06.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)local_d8,_Var29,
                   (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    )local_118._0_8_,end,comp_06);
        local_168.fractionality = ((FractionalInteger *)this)->fractionality;
        dVar46 = ((FractionalInteger *)this)->row_ep_norm2;
        local_168._20_8_ = *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4);
        local_168.score._0_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) >> 0x20);
        local_168.row_ep_norm2._0_4_ = SUB84(dVar46,0);
        local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar46 >> 0x20);
        ppVar28 = (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar13 = (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar14 = (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar34 = (_Var29._M_current)->row_ep_norm2;
        uVar4 = *(undefined8 *)((long)&(_Var29._M_current)->row_ep_norm2 + 4);
        uVar9 = *(undefined8 *)((long)&(_Var29._M_current)->score + 4);
        ((FractionalInteger *)this)->fractionality = (_Var29._M_current)->fractionality;
        ((FractionalInteger *)this)->row_ep_norm2 = dVar34;
        *(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) = uVar4;
        *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4) = uVar9;
        ppVar15 = ((_Var29._M_current)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             ((_Var29._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar15;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             ((_Var29._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(ulong *)((long)&(_Var29._M_current)->row_ep_norm2 + 4) =
             CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
        *(undefined8 *)((long)&(_Var29._M_current)->score + 4) = local_168._20_8_;
        (_Var29._M_current)->fractionality = local_168.fractionality;
        (_Var29._M_current)->row_ep_norm2 = dVar46;
        ((_Var29._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar13;
        ((_Var29._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar14;
        ((_Var29._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar28;
      }
      dVar46 = ((FractionalInteger *)this)->fractionality;
      if (((ulong)local_b8 & 1) == 0) {
        iVar6 = ((FractionalInteger *)this)->basisIndex;
        local_118._0_8_ = SEXT48(iVar6);
        dVar34 = (1.0 - dVar46) * dVar46;
        uVar4 = *(undefined8 *)
                 ((long)(end._M_current)->fractionality +
                 (long)((FractionalInteger *)((long)this + -0x38))->basisIndex * 8);
        auVar43._8_8_ =
             (1.0 - ((FractionalInteger *)((long)this + -0x38))->fractionality) *
             ((FractionalInteger *)((long)this + -0x38))->fractionality;
        auVar43._0_8_ = dVar34;
        auVar36._8_4_ = (int)uVar4;
        auVar36._0_8_ = *(undefined8 *)((long)(end._M_current)->fractionality + local_118._0_8_ * 8)
        ;
        auVar36._12_4_ = (int)((ulong)uVar4 >> 0x20);
        auVar36 = divpd(auVar43,auVar36);
        if ((auVar36._0_8_ < auVar36._8_8_) ||
           ((auVar36._0_8_ <= auVar36._8_8_ &&
            (uVar27 = (comp_00.edgeWt)->numTries + local_118._0_8_, uVar23 = uVar27 & 0xffffffff,
            uVar27 = uVar27 >> 0x20,
            uVar18 = (long)((FractionalInteger *)((long)this + -0x38))->basisIndex +
                     (comp_00.edgeWt)->numTries, uVar24 = uVar18 >> 0x20,
            uVar18 = uVar18 & 0xffffffff,
            ((uVar23 + 0x42d8680e260ae5b) * (uVar27 + 0x8a183895eeac1536) ^
            (uVar27 + 0x80c8963be3e4c2f3) * (uVar23 + 0xc8497d2a400d9551) >> 0x20) <
            ((uVar18 + 0x42d8680e260ae5b) * (uVar24 + 0x8a183895eeac1536) ^
            (uVar24 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20)))))
        goto LAB_002e7fb8;
        local_98 = ((FractionalInteger *)this)->row_ep_norm2;
        uStack_90 = SUB84(((FractionalInteger *)this)->score,0);
        uStack_8c = (undefined4)((ulong)((FractionalInteger *)this)->score >> 0x20);
        iVar6 = ((FractionalInteger *)this)->basisIndex;
        uVar47 = *(undefined4 *)
                  &(((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar48 = *(undefined4 *)
                  ((long)&(((FractionalInteger *)this)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
        pFVar32 = (FractionalInteger *)
                  (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar49 = *(undefined4 *)
                  &(((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar50 = *(undefined4 *)
                  ((long)&(((FractionalInteger *)this)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4);
        local_d8 = (FractionalInteger *)
                   (((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar8 = (end._M_current)->fractionality;
        lVar22 = (comp_00.edgeWt)->numTries;
        local_f8 = (FractionalInteger *)CONCAT44(local_f8._4_4_,iVar6);
        lVar20 = (long)iVar6;
        dVar40 = dVar34 / *(double *)((long)dVar8 + lVar20 * 8);
        uVar27 = lVar22 + lVar20 & 0xffffffff;
        uVar18 = (ulong)(lVar22 + lVar20) >> 0x20;
        local_118._0_8_ = &((FractionalInteger *)this)->row_ep;
        uVar27 = (uVar18 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20 ^
                 (uVar18 + 0x8a183895eeac1536) * (uVar27 + 0x42d8680e260ae5b);
        lVar17 = 0;
        while( true ) {
          dVar5 = *(double *)((long)&(local_130._M_current)->fractionality + lVar17);
          lVar30 = (long)*(int *)((long)&(local_130._M_current)->basisIndex + lVar17);
          dVar5 = ((1.0 - dVar5) * dVar5) / *(double *)((long)dVar8 + lVar30 * 8);
          if ((dVar40 <= dVar5) &&
             ((dVar40 < dVar5 ||
              (uVar18 = lVar30 + lVar22, uVar23 = uVar18 >> 0x20, uVar18 = uVar18 & 0xffffffff,
              uVar27 <= ((uVar18 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
                        (uVar23 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20)))))
          break;
          lVar17 = lVar17 + -0x38;
        }
        pFVar33 = (FractionalInteger *)((long)&(local_130._M_current)->fractionality + lVar17);
        if (lVar17 == 0) {
          pFVar25 = local_128._M_current + 1;
          while (pFVar31 = pFVar25, pFVar25 = pFVar31 + -1, pFVar19 = pFVar25, pFVar25 < pFVar33) {
            dVar5 = ((1.0 - pFVar31->fractionality) * pFVar31->fractionality) /
                    *(double *)((long)dVar8 + (long)pFVar31->basisIndex * 8);
            pFVar19 = pFVar31;
            if ((dVar5 < dVar40) ||
               ((pFVar25 = pFVar31 + 1, dVar5 <= dVar40 &&
                (uVar18 = pFVar31->basisIndex + lVar22, uVar23 = uVar18 >> 0x20,
                uVar18 = uVar18 & 0xffffffff,
                ((uVar18 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
                (uVar23 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20) < uVar27))))
            break;
          }
        }
        else {
          pFVar25 = local_128._M_current + 1;
          do {
            pFVar19 = pFVar25;
            dVar5 = ((1.0 - pFVar19->fractionality) * pFVar19->fractionality) /
                    *(double *)((long)dVar8 + (long)pFVar19->basisIndex * 8);
            pFVar25 = pFVar19;
            if (dVar5 < dVar40) break;
            pFVar25 = pFVar19 + 1;
          } while ((dVar40 < dVar5) ||
                  (uVar23 = pFVar19->basisIndex + lVar22, uVar18 = uVar23 >> 0x20,
                  uVar23 = uVar23 & 0xffffffff,
                  uVar27 <= ((uVar23 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                            (uVar18 + 0x80c8963be3e4c2f3) * (uVar23 + 0xc8497d2a400d9551) >> 0x20)))
          ;
        }
        if (pFVar19 < pFVar33) {
          do {
            local_168.fractionality = pFVar19->fractionality;
            dVar8 = pFVar19->row_ep_norm2;
            local_168._20_8_ = *(undefined8 *)((long)&pFVar19->score + 4);
            local_168.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar19->row_ep_norm2 + 4) >> 0x20);
            local_168.row_ep_norm2._0_4_ = SUB84(dVar8,0);
            local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
            ppVar28 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar13 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar40 = pFVar33->row_ep_norm2;
            uVar4 = *(undefined8 *)((long)&pFVar33->row_ep_norm2 + 4);
            uVar9 = *(undefined8 *)((long)&pFVar33->score + 4);
            pFVar19->fractionality = pFVar33->fractionality;
            pFVar19->row_ep_norm2 = dVar40;
            *(undefined8 *)((long)&pFVar19->row_ep_norm2 + 4) = uVar4;
            *(undefined8 *)((long)&pFVar19->score + 4) = uVar9;
            ppVar15 = (pFVar33->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pFVar33->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar15;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pFVar33->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(ulong *)((long)&pFVar33->row_ep_norm2 + 4) =
                 CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
            *(undefined8 *)((long)&pFVar33->score + 4) = local_168._20_8_;
            pFVar33->fractionality = local_168.fractionality;
            pFVar33->row_ep_norm2 = dVar8;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            dVar8 = (end._M_current)->fractionality;
            lVar22 = (comp_00.edgeWt)->numTries;
            dVar40 = dVar34 / *(double *)((long)dVar8 + lVar20 * 8);
            uVar27 = lVar22 + lVar20 & 0xffffffff;
            uVar18 = (ulong)(lVar22 + lVar20) >> 0x20;
            uVar27 = (uVar18 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20 ^
                     (uVar18 + 0x8a183895eeac1536) * (uVar27 + 0x42d8680e260ae5b);
            pFVar25 = pFVar33;
            do {
              do {
                pFVar33 = pFVar25 + -1;
                pFVar31 = pFVar25 + -1;
                dVar5 = ((1.0 - pFVar33->fractionality) * pFVar33->fractionality) /
                        *(double *)((long)dVar8 + (long)pFVar31->basisIndex * 8);
                pFVar25 = pFVar33;
              } while (dVar5 < dVar40);
            } while ((dVar5 <= dVar40) &&
                    (uVar23 = pFVar31->basisIndex + lVar22, uVar18 = uVar23 >> 0x20,
                    uVar23 = uVar23 & 0xffffffff,
                    ((uVar23 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                    (uVar18 + 0x80c8963be3e4c2f3) * (uVar23 + 0xc8497d2a400d9551) >> 0x20) < uVar27)
                    );
            pFVar25 = pFVar19 + 1;
            do {
              pFVar19 = pFVar25;
              dVar5 = ((1.0 - pFVar19->fractionality) * pFVar19->fractionality) /
                      *(double *)((long)dVar8 + (long)pFVar19->basisIndex * 8);
              pFVar25 = pFVar19;
              if (dVar5 < dVar40) break;
              pFVar25 = pFVar19 + 1;
            } while ((dVar40 < dVar5) ||
                    (uVar23 = pFVar19->basisIndex + lVar22, uVar18 = uVar23 >> 0x20,
                    uVar23 = uVar23 & 0xffffffff,
                    uVar27 <= ((uVar23 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                              (uVar18 + 0x80c8963be3e4c2f3) * (uVar23 + 0xc8497d2a400d9551) >> 0x20)
                    ));
          } while (pFVar19 < pFVar33);
          ppVar28 = (((FractionalInteger *)this)->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          ppVar28 = (pointer)0x0;
        }
        dVar34 = pFVar33->fractionality;
        dVar8 = pFVar33->row_ep_norm2;
        uVar4 = *(undefined8 *)((long)&pFVar33->score + 4);
        *(undefined8 *)((long)&(local_128._M_current)->row_ep_norm2 + 4) =
             *(undefined8 *)((long)&pFVar33->row_ep_norm2 + 4);
        *(undefined8 *)((long)&(local_128._M_current)->score + 4) = uVar4;
        (local_128._M_current)->fractionality = dVar34;
        (local_128._M_current)->row_ep_norm2 = dVar8;
        ppVar13 = (pFVar33->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ((local_128._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pFVar33->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ((local_128._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar13;
        ((local_128._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pFVar33->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar33->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar33->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar33->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar28 == (pointer)0x0) {
          ppVar28 = (pointer)0x0;
        }
        else {
          local_118._8_8_ = 0;
          local_118._0_8_ = dVar46;
          local_128._M_current = pFVar32;
          uStack_120 = uVar49;
          uStack_11c = uVar50;
          operator_delete(ppVar28);
          ppVar28 = (pFVar33->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar46 = (double)local_118._0_8_;
          uVar47 = (int)local_128._M_current;
          uVar48 = local_128._M_current._4_4_;
          uVar49 = uStack_120;
          uVar50 = uStack_11c;
        }
        pFVar33->fractionality = dVar46;
        pFVar33->row_ep_norm2 = local_98;
        pFVar33->score = (double)CONCAT44(uStack_8c,uStack_90);
        pFVar33->basisIndex = (HighsInt)local_f8;
        *(undefined4 *)
         &(pFVar33->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = uVar47;
        *(undefined4 *)
         ((long)&(pFVar33->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = uVar48;
        *(undefined4 *)
         &(pFVar33->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = uVar49;
        *(undefined4 *)
         ((long)&(pFVar33->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar50;
        (pFVar33->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)local_d8;
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28);
        }
        this = (pdqsort_detail *)(pFVar33 + 1);
        uVar27 = (long)begin._M_current - (long)this;
      }
      else {
        dVar34 = (1.0 - dVar46) * dVar46;
        local_118._0_8_ = SEXT48(((FractionalInteger *)this)->basisIndex);
        iVar6 = ((FractionalInteger *)this)->basisIndex;
LAB_002e7fb8:
        local_fc = iVar6;
        local_98 = ((FractionalInteger *)this)->row_ep_norm2;
        uStack_90 = SUB84(((FractionalInteger *)this)->score,0);
        uStack_8c = (undefined4)((ulong)((FractionalInteger *)this)->score >> 0x20);
        uVar47 = *(undefined4 *)
                  &(((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar48 = *(undefined4 *)
                  ((long)&(((FractionalInteger *)this)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
        uVar49 = *(undefined4 *)
                  &(((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar50 = *(undefined4 *)
                  ((long)&(((FractionalInteger *)this)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4);
        local_50 = (((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar8 = (end._M_current)->fractionality;
        lVar22 = (comp_00.edgeWt)->numTries;
        dVar40 = dVar34 / *(double *)((long)dVar8 + local_118._0_8_ * 8);
        uVar18 = lVar22 + local_118._0_8_ & 0xffffffff;
        uVar27 = (ulong)(lVar22 + local_118._0_8_) >> 0x20;
        local_d8 = (FractionalInteger *)&((FractionalInteger *)this)->row_ep;
        pFVar25 = (FractionalInteger *)
                  ((uVar27 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                  (uVar27 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b));
        lVar20 = 0x38;
        while( true ) {
          dVar5 = *(double *)((long)&((FractionalInteger *)this)->fractionality + lVar20);
          lVar17 = (long)*(int *)((long)&((FractionalInteger *)this)->basisIndex + lVar20);
          dVar5 = ((1.0 - dVar5) * dVar5) / *(double *)((long)dVar8 + lVar17 * 8);
          if ((dVar5 <= dVar40) &&
             ((dVar5 < dVar40 ||
              (uVar27 = lVar17 + lVar22, uVar18 = uVar27 >> 0x20, uVar27 = uVar27 & 0xffffffff,
              (FractionalInteger *)
              ((uVar27 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
              (uVar18 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <= pFVar25))))
          break;
          lVar20 = lVar20 + 0x38;
        }
        local_58 = (FractionalInteger *)((long)&((FractionalInteger *)this)->fractionality + lVar20)
        ;
        _Var26._M_current = local_130._M_current;
        _Var29._M_current = local_130._M_current;
        if (lVar20 == 0x38) {
          while (pFVar33 = _Var26._M_current, pFVar32 = pFVar33 + 1, local_58 < pFVar33 + 1) {
            _Var29._M_current = (FractionalInteger *)(long)pFVar33->basisIndex;
            dVar5 = ((1.0 - pFVar33->fractionality) * pFVar33->fractionality) /
                    *(double *)((long)dVar8 + (long)_Var29._M_current * 8);
            pFVar32 = pFVar33;
            if ((dVar40 < dVar5) ||
               ((_Var26._M_current = pFVar33 + -1, dVar40 <= dVar5 &&
                (uVar27 = (long)&(_Var29._M_current)->fractionality + lVar22,
                uVar18 = uVar27 >> 0x20, uVar27 = uVar27 & 0xffffffff,
                _Var29._M_current =
                     (FractionalInteger *)
                     ((uVar27 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                     (uVar18 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20),
                pFVar25 < _Var29._M_current)))) break;
          }
        }
        else {
          do {
            pFVar32 = _Var29._M_current;
            dVar5 = ((1.0 - pFVar32->fractionality) * pFVar32->fractionality) /
                    *(double *)((long)dVar8 + (long)pFVar32->basisIndex * 8);
            _Var29._M_current = pFVar32;
            if (dVar40 < dVar5) break;
            _Var29._M_current = pFVar32 + -1;
          } while ((dVar5 < dVar40) ||
                  (uVar27 = pFVar32->basisIndex + lVar22, uVar18 = uVar27 >> 0x20,
                  uVar27 = uVar27 & 0xffffffff,
                  (FractionalInteger *)
                  ((uVar27 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                  (uVar18 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <= pFVar25)
                  );
        }
        pFVar25 = pFVar32;
        pFVar33 = local_58;
        if (local_58 < pFVar32) {
          do {
            local_168.fractionality = pFVar33->fractionality;
            dVar8 = pFVar33->row_ep_norm2;
            local_168._20_8_ = *(undefined8 *)((long)&pFVar33->score + 4);
            local_168.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar33->row_ep_norm2 + 4) >> 0x20);
            local_168.row_ep_norm2._0_4_ = SUB84(dVar8,0);
            local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
            ppVar28 = (pFVar33->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar13 = (pFVar33->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = (pFVar33->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar40 = pFVar25->row_ep_norm2;
            uVar4 = *(undefined8 *)((long)&pFVar25->row_ep_norm2 + 4);
            uVar9 = *(undefined8 *)((long)&pFVar25->score + 4);
            pFVar33->fractionality = pFVar25->fractionality;
            pFVar33->row_ep_norm2 = dVar40;
            *(undefined8 *)((long)&pFVar33->row_ep_norm2 + 4) = uVar4;
            *(undefined8 *)((long)&pFVar33->score + 4) = uVar9;
            ppVar15 = (pFVar25->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pFVar25->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar15;
            (pFVar33->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pFVar25->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(ulong *)((long)&pFVar25->row_ep_norm2 + 4) =
                 CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
            *(undefined8 *)((long)&pFVar25->score + 4) = local_168._20_8_;
            pFVar25->fractionality = local_168.fractionality;
            pFVar25->row_ep_norm2 = dVar8;
            (pFVar25->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            (pFVar25->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            (pFVar25->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            dVar8 = (end._M_current)->fractionality;
            lVar22 = (comp_00.edgeWt)->numTries;
            dVar40 = dVar34 / *(double *)((long)dVar8 + local_118._0_8_ * 8);
            uVar18 = lVar22 + local_118._0_8_ & 0xffffffff;
            uVar27 = (ulong)(lVar22 + local_118._0_8_) >> 0x20;
            uVar27 = (uVar27 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                     (uVar27 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b);
            do {
              do {
                pFVar19 = pFVar33 + 1;
                pFVar31 = pFVar33 + 1;
                dVar5 = ((1.0 - pFVar19->fractionality) * pFVar19->fractionality) /
                        *(double *)((long)dVar8 + (long)pFVar31->basisIndex * 8);
                pFVar33 = pFVar19;
              } while (dVar40 < dVar5);
            } while ((dVar40 <= dVar5) &&
                    (uVar18 = pFVar31->basisIndex + lVar22, uVar23 = uVar18 >> 0x20,
                    uVar18 = uVar18 & 0xffffffff,
                    uVar27 < ((uVar18 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
                             (uVar23 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20))
                    );
            _Var29._M_current = pFVar25 + -1;
            do {
              pFVar25 = _Var29._M_current;
              dVar5 = ((1.0 - pFVar25->fractionality) * pFVar25->fractionality) /
                      *(double *)((long)dVar8 + (long)pFVar25->basisIndex * 8);
              _Var29._M_current = pFVar25;
              if (dVar40 < dVar5) break;
              _Var29._M_current = pFVar25 + -1;
            } while ((dVar5 < dVar40) ||
                    (uVar18 = pFVar25->basisIndex + lVar22, uVar23 = uVar18 >> 0x20,
                    uVar18 = uVar18 & 0xffffffff,
                    ((uVar18 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
                    (uVar23 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20) <= uVar27
                    ));
          } while (pFVar19 < pFVar25);
          ppVar28 = (((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     local_d8)->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          this = (pdqsort_detail *)local_128;
        }
        else {
          ppVar28 = (pointer)0x0;
          pFVar19 = local_58;
        }
        dVar34 = pFVar19[-1].fractionality;
        dVar8 = pFVar19[-1].row_ep_norm2;
        uVar4 = *(undefined8 *)((long)&pFVar19[-1].score + 4);
        *(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) =
             *(undefined8 *)((long)&pFVar19[-1].row_ep_norm2 + 4);
        *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4) = uVar4;
        ((FractionalInteger *)this)->fractionality = dVar34;
        ((FractionalInteger *)this)->row_ep_norm2 = dVar8;
        ppVar13 = pFVar19[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             pFVar19[-1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar13;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             pFVar19[-1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        pFVar19[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        pFVar19[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        pFVar19[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar28 == (pointer)0x0) {
          ppVar28 = (pointer)0x0;
        }
        else {
          local_60 = &pFVar19[-1].row_ep;
          local_118._8_8_ = 0;
          local_48 = uVar47;
          uStack_44 = uVar48;
          uStack_40 = uVar49;
          uStack_3c = uVar50;
          local_118._0_8_ = dVar46;
          operator_delete(ppVar28);
          ppVar28 = (local_60->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          dVar46 = (double)local_118._0_8_;
          uVar47 = local_48;
          uVar48 = uStack_44;
          uVar49 = uStack_40;
          uVar50 = uStack_3c;
        }
        pFVar19[-1].fractionality = dVar46;
        pFVar19[-1].row_ep_norm2 = local_98;
        pFVar19[-1].score = (double)CONCAT44(uStack_8c,uStack_90);
        pFVar19[-1].basisIndex = local_fc;
        *(undefined4 *)
         &pFVar19[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = uVar47;
        *(undefined4 *)
         ((long)&pFVar19[-1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = uVar48;
        *(undefined4 *)
         &pFVar19[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = uVar49;
        *(undefined4 *)
         ((long)&pFVar19[-1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar50;
        pFVar19[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = local_50;
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28);
        }
        _Var26._M_current = pFVar19 + -1;
        uVar18 = ((long)_Var26._M_current - (long)local_c0 >> 3) * 0x6db6db6db6db6db7;
        local_118._0_8_ = (long)begin._M_current - (long)pFVar19;
        uVar27 = ((long)local_118._0_8_ >> 3) * 0x6db6db6db6db6db7;
        if (((long)uVar18 < (long)((ulong)local_f8 >> 3)) ||
           ((long)uVar27 < (long)((ulong)local_f8 >> 3))) {
          local_dc = local_dc + -1;
          if (local_dc == 0) {
            uVar27 = (ulong)((long)&local_f8[-1].row_ep.
                                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) >> 1;
            pppVar21 = &local_128._M_current[uVar27].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_dc = 0;
            do {
              local_168.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *pppVar21;
              local_168.fractionality = (double)pppVar21[-6];
              uVar4 = pppVar21[-5];
              uVar9 = *(undefined8 *)((long)pppVar21 + -0x24);
              local_168._20_8_ = *(undefined8 *)((long)pppVar21 + -0x1c);
              local_168.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   ((_Vector_impl_data *)(pppVar21 + -2))->_M_start;
              local_168.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pppVar21[-1];
              ((_Vector_impl_data *)(pppVar21 + -2))->_M_start = (pointer)0x0;
              pppVar21[-1] = (pointer)0x0;
              *pppVar21 = (pointer)0x0;
              local_168.score._0_4_ = (undefined4)((ulong)uVar9 >> 0x20);
              local_168.row_ep_norm2._0_4_ = (undefined4)uVar4;
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
              __comp._M_comp.this = comp_00.edgeWt;
              __comp._M_comp.edgeWt = (double **)end._M_current;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>>
                        (local_128,uVar27,(long)local_f8,&local_168,__comp);
              if (local_168.row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.row_ep.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              pppVar21 = pppVar21 + -7;
              bVar16 = uVar27 != 0;
              uVar27 = uVar27 - 1;
            } while (bVar16);
            pppVar21 = &begin._M_current[-1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            lVar22 = (long)begin._M_current - (long)local_c0;
            do {
              local_168.fractionality = (double)pppVar21[-6];
              local_168._20_8_ = *(undefined8 *)((long)pppVar21 + -0x1c);
              uStack_88 = (undefined4)((ulong)*(undefined8 *)((long)pppVar21 + -0x24) >> 0x20);
              uStack_90 = SUB84(pppVar21[-5],0);
              uStack_8c = (undefined4)((ulong)pppVar21[-5] >> 0x20);
              local_168.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *pppVar21;
              lVar22 = lVar22 + -0x38;
              local_168.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   ((_Vector_impl_data *)(pppVar21 + -2))->_M_start;
              local_168.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pppVar21[-1];
              *pppVar21 = (pointer)0x0;
              ((_Vector_impl_data *)(pppVar21 + -2))->_M_start = (pointer)0x0;
              pppVar21[-1] = (pointer)0x0;
              dVar46 = (local_128._M_current)->row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&(local_128._M_current)->row_ep_norm2 + 4);
              uVar9 = *(undefined8 *)((long)&(local_128._M_current)->score + 4);
              pppVar21[-6] = (pointer)(local_128._M_current)->fractionality;
              pppVar21[-5] = (pointer)dVar46;
              *(undefined8 *)((long)pppVar21 + -0x24) = uVar4;
              *(undefined8 *)((long)pppVar21 + -0x1c) = uVar9;
              ppVar28 = ((local_128._M_current)->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              ((_Vector_impl_data *)(pppVar21 + -2))->_M_start =
                   ((local_128._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pppVar21[-1] = ppVar28;
              *pppVar21 = ((local_128._M_current)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined8 *)((long)local_d8 + 0x10) = 0;
              local_d8->fractionality = 0;
              local_d8->row_ep_norm2 = 0.0;
              local_168.score._0_4_ = uStack_88;
              __comp_00._M_comp.this = comp_00.edgeWt;
              __comp_00._M_comp.edgeWt = (double **)end._M_current;
              local_168.row_ep_norm2._0_4_ = uStack_90;
              local_168.row_ep_norm2._4_4_ = uStack_8c;
              local_98 = local_168.fractionality;
              uStack_84 = local_168._20_8_;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>>
                        (local_128,0,(lVar22 >> 3) * 0x6db6db6db6db6db7,&local_168,__comp_00);
              if (local_168.row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.row_ep.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              pppVar21 = pppVar21 + -7;
            } while (0x38 < lVar22);
            return;
          }
          if (0x508 < (long)_Var26._M_current - (long)local_c0) {
            uVar23 = uVar18 >> 2;
            dVar46 = (local_128._M_current)->fractionality;
            dVar34 = (local_128._M_current)->row_ep_norm2;
            uVar4 = *(undefined8 *)((long)&(local_128._M_current)->score + 4);
            local_168.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(local_128._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
            ppVar28 = ((local_128._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar13 = ((local_128._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = ((local_128._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)((long)local_d8 + 0x10) = 0;
            local_d8->fractionality = 0;
            local_d8->row_ep_norm2 = 0.0;
            dVar8 = local_128._M_current[uVar23].fractionality;
            dVar40 = local_128._M_current[uVar23].row_ep_norm2;
            puVar3 = (undefined8 *)((long)&local_128._M_current[uVar23].row_ep_norm2 + 4);
            uVar9 = puVar3[1];
            *(undefined8 *)((long)&(local_128._M_current)->row_ep_norm2 + 4) = *puVar3;
            *(undefined8 *)((long)&(local_128._M_current)->score + 4) = uVar9;
            (local_128._M_current)->fractionality = dVar8;
            (local_128._M_current)->row_ep_norm2 = dVar40;
            ppVar15 = local_128._M_current[uVar23].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((local_128._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 local_128._M_current[uVar23].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((local_128._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar15;
            ((local_128._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_128._M_current[uVar23].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar3 = (undefined8 *)((long)&local_128._M_current[uVar23].row_ep_norm2 + 4);
            *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
            puVar3[1] = uVar4;
            local_128._M_current[uVar23].fractionality = dVar46;
            local_128._M_current[uVar23].row_ep_norm2 = dVar34;
            local_128._M_current[uVar23].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            local_128._M_current[uVar23].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            local_128._M_current[uVar23].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            local_168.fractionality = pFVar19[-2].fractionality;
            dVar46 = pFVar19[-2].row_ep_norm2;
            local_168._20_8_ = *(undefined8 *)((long)&pFVar19[-2].score + 4);
            local_168.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar19[-2].row_ep_norm2 + 4) >> 0x20);
            local_168.row_ep_norm2._0_4_ = SUB84(dVar46,0);
            local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar46 >> 0x20);
            ppVar28 = pFVar19[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar13 = pFVar19[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = pFVar19[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pFVar19[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pFVar19[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pFVar19[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar34 = _Var26._M_current[-uVar23].row_ep_norm2;
            puVar3 = (undefined8 *)((long)&pFVar19[-1 - uVar23].row_ep_norm2 + 4);
            uVar4 = *puVar3;
            uVar9 = puVar3[1];
            pFVar19[-2].fractionality = _Var26._M_current[-uVar23].fractionality;
            pFVar19[-2].row_ep_norm2 = dVar34;
            *(undefined8 *)((long)&pFVar19[-2].row_ep_norm2 + 4) = uVar4;
            *(undefined8 *)((long)&pFVar19[-2].score + 4) = uVar9;
            ppVar15 = pFVar19[-1 - uVar23].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pFVar19[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 pFVar19[-1 - uVar23].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pFVar19[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar15;
            pFVar19[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 pFVar19[-1 - uVar23].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar3 = (undefined8 *)((long)&pFVar19[-1 - uVar23].row_ep_norm2 + 4);
            *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
            puVar3[1] = local_168._20_8_;
            _Var26._M_current[-uVar23].fractionality = local_168.fractionality;
            _Var26._M_current[-uVar23].row_ep_norm2 = dVar46;
            pFVar19[-1 - uVar23].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            pFVar19[-1 - uVar23].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            pFVar19[-1 - uVar23].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            if (0x80 < uVar18) {
              dVar46 = local_128._M_current[1].fractionality;
              dVar34 = local_128._M_current[1].row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&local_128._M_current[1].score + 4);
              local_168.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&local_128._M_current[1].row_ep_norm2 + 4) >> 0x20)
              ;
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
              ppVar28 = local_128._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = local_128._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = local_128._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_128._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_128._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = local_128._M_current[uVar23 + 1].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&local_128._M_current[uVar23 + 1].row_ep_norm2 + 4);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              local_128._M_current[1].fractionality = local_128._M_current[uVar23 + 1].fractionality
              ;
              local_128._M_current[1].row_ep_norm2 = dVar8;
              *(undefined8 *)((long)&local_128._M_current[1].row_ep_norm2 + 4) = uVar9;
              *(undefined8 *)((long)&local_128._M_current[1].score + 4) = uVar10;
              ppVar15 = local_128._M_current[uVar23 + 1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_128._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   local_128._M_current[uVar23 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_128._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              local_128._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_128._M_current[uVar23 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&local_128._M_current[uVar23 + 1].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = uVar4;
              local_128._M_current[uVar23 + 1].fractionality = dVar46;
              local_128._M_current[uVar23 + 1].row_ep_norm2 = dVar34;
              local_128._M_current[uVar23 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              local_128._M_current[uVar23 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              local_128._M_current[uVar23 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              dVar46 = local_128._M_current[2].fractionality;
              dVar34 = local_128._M_current[2].row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&local_128._M_current[2].score + 4);
              local_168.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&local_128._M_current[2].row_ep_norm2 + 4) >> 0x20)
              ;
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
              ppVar28 = local_128._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = local_128._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = local_128._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_128._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_128._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = local_128._M_current[uVar23 + 2].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&local_128._M_current[uVar23 + 2].row_ep_norm2 + 4);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              local_128._M_current[2].fractionality = local_128._M_current[uVar23 + 2].fractionality
              ;
              local_128._M_current[2].row_ep_norm2 = dVar8;
              *(undefined8 *)((long)&local_128._M_current[2].row_ep_norm2 + 4) = uVar9;
              *(undefined8 *)((long)&local_128._M_current[2].score + 4) = uVar10;
              ppVar15 = local_128._M_current[uVar23 + 2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_128._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   local_128._M_current[uVar23 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_128._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              local_128._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_128._M_current[uVar23 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&local_128._M_current[uVar23 + 2].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = uVar4;
              local_128._M_current[uVar23 + 2].fractionality = dVar46;
              local_128._M_current[uVar23 + 2].row_ep_norm2 = dVar34;
              local_128._M_current[uVar23 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              local_128._M_current[uVar23 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              local_128._M_current[uVar23 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              uVar18 = ~uVar23;
              dVar46 = pFVar19[-3].fractionality;
              dVar34 = pFVar19[-3].row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&pFVar19[-3].score + 4);
              local_168.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar19[-3].row_ep_norm2 + 4) >> 0x20)
              ;
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
              ppVar28 = pFVar19[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = pFVar19[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = pFVar19[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar19[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = _Var26._M_current[uVar18].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&pFVar19[uVar18 - 1].row_ep_norm2 + 4);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              pFVar19[-3].fractionality = _Var26._M_current[uVar18].fractionality;
              pFVar19[-3].row_ep_norm2 = dVar8;
              *(undefined8 *)((long)&pFVar19[-3].row_ep_norm2 + 4) = uVar9;
              *(undefined8 *)((long)&pFVar19[-3].score + 4) = uVar10;
              ppVar15 = pFVar19[uVar18 - 1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pFVar19[uVar18 - 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pFVar19[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              pFVar19[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pFVar19[uVar18 - 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&pFVar19[uVar18 - 1].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = uVar4;
              _Var26._M_current[uVar18].fractionality = dVar46;
              _Var26._M_current[uVar18].row_ep_norm2 = dVar34;
              pFVar19[uVar18 - 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              pFVar19[uVar18 - 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              pFVar19[uVar18 - 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              lVar22 = -uVar23;
              local_168.fractionality = pFVar19[-4].fractionality;
              dVar46 = pFVar19[-4].row_ep_norm2;
              local_168._20_8_ = *(undefined8 *)((long)&pFVar19[-4].score + 4);
              local_168.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar19[-4].row_ep_norm2 + 4) >> 0x20)
              ;
              local_168.row_ep_norm2._0_4_ = SUB84(dVar46,0);
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar46 >> 0x20);
              ppVar28 = pFVar19[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = pFVar19[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = pFVar19[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar19[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar34 = _Var26._M_current[lVar22 + -2].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&pFVar19[lVar22 + -3].row_ep_norm2 + 4);
              uVar4 = *puVar3;
              uVar9 = puVar3[1];
              pFVar19[-4].fractionality = _Var26._M_current[lVar22 + -2].fractionality;
              pFVar19[-4].row_ep_norm2 = dVar34;
              *(undefined8 *)((long)&pFVar19[-4].row_ep_norm2 + 4) = uVar4;
              *(undefined8 *)((long)&pFVar19[-4].score + 4) = uVar9;
              ppVar15 = pFVar19[lVar22 + -3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pFVar19[lVar22 + -3].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pFVar19[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              pFVar19[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pFVar19[lVar22 + -3].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&pFVar19[lVar22 + -3].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = local_168._20_8_;
              _Var26._M_current[lVar22 + -2].fractionality = local_168.fractionality;
              _Var26._M_current[lVar22 + -2].row_ep_norm2 = dVar46;
              pFVar19[lVar22 + -3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              pFVar19[lVar22 + -3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              pFVar19[lVar22 + -3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            }
          }
          if (0x508 < (long)local_118._0_8_) {
            uVar18 = uVar27 >> 2;
            dVar46 = pFVar19->fractionality;
            dVar34 = pFVar19->row_ep_norm2;
            uVar4 = *(undefined8 *)((long)&pFVar19->score + 4);
            local_168.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar19->row_ep_norm2 + 4) >> 0x20);
            local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
            ppVar28 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar13 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar8 = pFVar19[uVar18].row_ep_norm2;
            puVar3 = (undefined8 *)((long)&pFVar19[uVar18].row_ep_norm2 + 4);
            uVar9 = *puVar3;
            uVar10 = puVar3[1];
            pFVar19->fractionality = pFVar19[uVar18].fractionality;
            pFVar19->row_ep_norm2 = dVar8;
            *(undefined8 *)((long)&pFVar19->row_ep_norm2 + 4) = uVar9;
            *(undefined8 *)((long)&pFVar19->score + 4) = uVar10;
            ppVar15 = pFVar19[uVar18].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 pFVar19[uVar18].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar15;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 pFVar19[uVar18].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar3 = (undefined8 *)((long)&pFVar19[uVar18].row_ep_norm2 + 4);
            *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
            puVar3[1] = uVar4;
            pFVar19[uVar18].fractionality = dVar46;
            pFVar19[uVar18].row_ep_norm2 = dVar34;
            pFVar19[uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            pFVar19[uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            pFVar19[uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            local_168.fractionality = (local_130._M_current)->fractionality;
            dVar46 = (local_130._M_current)->row_ep_norm2;
            local_168._20_8_ = *(undefined8 *)((long)&(local_130._M_current)->score + 4);
            local_168.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(local_130._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_168.row_ep_norm2._0_4_ = SUB84(dVar46,0);
            local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar46 >> 0x20);
            ppVar28 = begin._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar13 = begin._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar14 = begin._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (local_68->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (local_68->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_68->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar34 = begin._M_current[-uVar18].fractionality;
            dVar8 = begin._M_current[-uVar18].row_ep_norm2;
            puVar3 = (undefined8 *)((long)&begin._M_current[-uVar18].row_ep_norm2 + 4);
            uVar4 = puVar3[1];
            *(undefined8 *)((long)&(local_130._M_current)->row_ep_norm2 + 4) = *puVar3;
            *(undefined8 *)((long)&(local_130._M_current)->score + 4) = uVar4;
            (local_130._M_current)->fractionality = dVar34;
            (local_130._M_current)->row_ep_norm2 = dVar8;
            ppVar15 = begin._M_current[-uVar18].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            begin._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 begin._M_current[-uVar18].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            begin._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar15;
            begin._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 begin._M_current[-uVar18].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar3 = (undefined8 *)((long)&begin._M_current[-uVar18].row_ep_norm2 + 4);
            *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
            puVar3[1] = local_168._20_8_;
            begin._M_current[-uVar18].fractionality = local_168.fractionality;
            begin._M_current[-uVar18].row_ep_norm2 = dVar46;
            begin._M_current[-uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar13;
            begin._M_current[-uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            begin._M_current[-uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            if (0x80 < uVar27) {
              dVar46 = pFVar19[1].fractionality;
              dVar34 = pFVar19[1].row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&pFVar19[1].score + 4);
              local_168.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar19[1].row_ep_norm2 + 4) >> 0x20);
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
              ppVar28 = pFVar19[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = pFVar19[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = pFVar19[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar19[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = pFVar19[uVar18 + 1].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&pFVar19[uVar18 + 1].row_ep_norm2 + 4);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              pFVar19[1].fractionality = pFVar19[uVar18 + 1].fractionality;
              pFVar19[1].row_ep_norm2 = dVar8;
              *(undefined8 *)((long)&pFVar19[1].row_ep_norm2 + 4) = uVar9;
              *(undefined8 *)((long)&pFVar19[1].score + 4) = uVar10;
              ppVar15 = pFVar19[uVar18 + 1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pFVar19[uVar18 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pFVar19[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              pFVar19[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pFVar19[uVar18 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&pFVar19[uVar18 + 1].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = uVar4;
              pFVar19[uVar18 + 1].fractionality = dVar46;
              pFVar19[uVar18 + 1].row_ep_norm2 = dVar34;
              pFVar19[uVar18 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              pFVar19[uVar18 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              pFVar19[uVar18 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              dVar46 = pFVar19[2].fractionality;
              dVar34 = pFVar19[2].row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&pFVar19[2].score + 4);
              local_168.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar19[2].row_ep_norm2 + 4) >> 0x20);
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
              ppVar28 = pFVar19[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = pFVar19[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = pFVar19[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar19[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = pFVar19[uVar18 + 2].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&pFVar19[uVar18 + 2].row_ep_norm2 + 4);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              pFVar19[2].fractionality = pFVar19[uVar18 + 2].fractionality;
              pFVar19[2].row_ep_norm2 = dVar8;
              *(undefined8 *)((long)&pFVar19[2].row_ep_norm2 + 4) = uVar9;
              *(undefined8 *)((long)&pFVar19[2].score + 4) = uVar10;
              ppVar15 = pFVar19[uVar18 + 2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pFVar19[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pFVar19[uVar18 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pFVar19[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              pFVar19[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pFVar19[uVar18 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&pFVar19[uVar18 + 2].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = uVar4;
              pFVar19[uVar18 + 2].fractionality = dVar46;
              pFVar19[uVar18 + 2].row_ep_norm2 = dVar34;
              pFVar19[uVar18 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              pFVar19[uVar18 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              pFVar19[uVar18 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              uVar27 = ~uVar18;
              dVar46 = (local_a0._M_current)->fractionality;
              dVar34 = (local_a0._M_current)->row_ep_norm2;
              uVar4 = *(undefined8 *)((long)&(local_a0._M_current)->score + 4);
              local_168.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&(local_a0._M_current)->row_ep_norm2 + 4) >> 0x20);
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar34 >> 0x20);
              ppVar28 = begin._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = begin._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = begin._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              (local_70->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_70->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_70->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = begin._M_current[uVar27].fractionality;
              dVar40 = begin._M_current[uVar27].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&begin._M_current[uVar27].row_ep_norm2 + 4);
              uVar9 = puVar3[1];
              *(undefined8 *)((long)&(local_a0._M_current)->row_ep_norm2 + 4) = *puVar3;
              *(undefined8 *)((long)&(local_a0._M_current)->score + 4) = uVar9;
              (local_a0._M_current)->fractionality = dVar8;
              (local_a0._M_current)->row_ep_norm2 = dVar40;
              ppVar15 = begin._M_current[uVar27].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   begin._M_current[uVar27].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              begin._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              begin._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   begin._M_current[uVar27].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&begin._M_current[uVar27].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = uVar4;
              begin._M_current[uVar27].fractionality = dVar46;
              begin._M_current[uVar27].row_ep_norm2 = dVar34;
              begin._M_current[uVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              begin._M_current[uVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              begin._M_current[uVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              lVar22 = -2 - uVar18;
              local_168.fractionality = (local_a8._M_current)->fractionality;
              dVar46 = (local_a8._M_current)->row_ep_norm2;
              local_168._20_8_ = *(undefined8 *)((long)&(local_a8._M_current)->score + 4);
              local_168.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&(local_a8._M_current)->row_ep_norm2 + 4) >> 0x20);
              local_168.row_ep_norm2._0_4_ = SUB84(dVar46,0);
              local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar46 >> 0x20);
              ppVar28 = begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar13 = begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar14 = begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              (local_78->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_78->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_78->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar34 = begin._M_current[lVar22].fractionality;
              dVar8 = begin._M_current[lVar22].row_ep_norm2;
              puVar3 = (undefined8 *)((long)&begin._M_current[lVar22].row_ep_norm2 + 4);
              uVar4 = puVar3[1];
              *(undefined8 *)((long)&(local_a8._M_current)->row_ep_norm2 + 4) = *puVar3;
              *(undefined8 *)((long)&(local_a8._M_current)->score + 4) = uVar4;
              (local_a8._M_current)->fractionality = dVar34;
              (local_a8._M_current)->row_ep_norm2 = dVar8;
              ppVar15 = begin._M_current[lVar22].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   begin._M_current[lVar22].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar15;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   begin._M_current[lVar22].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)((long)&begin._M_current[lVar22].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(local_168.score._0_4_,local_168.row_ep_norm2._4_4_);
              puVar3[1] = local_168._20_8_;
              begin._M_current[lVar22].fractionality = local_168.fractionality;
              begin._M_current[lVar22].row_ep_norm2 = dVar46;
              begin._M_current[lVar22].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar13;
              begin._M_current[lVar22].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              begin._M_current[lVar22].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            }
          }
        }
        else if (((pFVar32 <= local_58) &&
                 (comp_00.this = (HighsTableauSeparator *)_Var29._M_current,
                 local_f8 = _Var26._M_current,
                 bVar16 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                                    ((pdqsort_detail *)local_128._M_current,_Var26,end,comp_00),
                 _Var26._M_current = local_f8, bVar16)) &&
                (comp_01.this = (HighsTableauSeparator *)_Var29._M_current,
                comp_01.edgeWt = (double **)comp_00.edgeWt,
                bVar16 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                                   ((pdqsort_detail *)pFVar19,begin,end,comp_01),
                _Var26._M_current = local_f8, bVar16)) {
          return;
        }
        pFVar25 = (FractionalInteger *)(ulong)(local_b8._0_1_ & 1);
        comp_02.this._0_4_ = local_dc;
        comp_02.edgeWt = (double **)comp_00.edgeWt;
        comp_02.this._4_4_ = 0;
        pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
                  ((pdqsort_detail *)local_128._M_current,_Var26,end,comp_02,local_b8._0_1_ & 1,
                   (bool)in_stack_fffffffffffffe78);
        local_b8 = (double)((ulong)local_b8 & 0xffffffff00000000);
        uVar27 = local_118._0_8_;
        this = (pdqsort_detail *)pFVar19;
      }
    } while (0x53f < (long)uVar27);
    if (((ulong)local_b8 & 1) == 0) goto LAB_002e8fc1;
  }
  if (((FractionalInteger *)this != begin._M_current) &&
     (_Var29._M_current = (FractionalInteger *)((long)this + 0x38),
     _Var29._M_current != begin._M_current)) {
    local_130._M_current = (FractionalInteger *)0x0;
    local_128._M_current = (FractionalInteger *)this;
    do {
      local_f8 = (FractionalInteger *)local_128._M_current[1].fractionality;
      local_b8 = (double)CONCAT44(local_b8._4_4_,local_128._M_current[1].basisIndex);
      lVar22 = (long)local_128._M_current[1].basisIndex;
      ppStack_f0 = (pointer)0x0;
      dVar46 = (1.0 - (local_128._M_current)->fractionality) * (local_128._M_current)->fractionality
      ;
      dVar34 = (1.0 - (double)local_f8) * (double)local_f8;
      auVar41._8_8_ = *(undefined8 *)((long)(end._M_current)->fractionality + lVar22 * 8);
      auVar41._0_8_ =
           *(undefined8 *)
            ((long)(end._M_current)->fractionality + (long)(local_128._M_current)->basisIndex * 8);
      local_118._8_4_ = SUB84(dVar34,0);
      local_118._0_8_ = dVar46;
      local_118._12_4_ = (int)((ulong)dVar34 >> 0x20);
      auVar35._8_8_ = dVar34;
      auVar35._0_8_ = dVar46;
      auVar36 = divpd(auVar35,auVar41);
      if ((auVar36._0_8_ < auVar36._8_8_) ||
         ((auVar36._0_8_ <= auVar36._8_8_ &&
          (uVar27 = (long)(local_128._M_current)->basisIndex + (comp_00.edgeWt)->numTries,
          uVar23 = uVar27 >> 0x20, uVar27 = uVar27 & 0xffffffff,
          uVar18 = (comp_00.edgeWt)->numTries + lVar22, uVar24 = uVar18 & 0xffffffff,
          uVar18 = uVar18 >> 0x20,
          ((uVar27 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
          (uVar23 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <
          ((uVar24 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
          (uVar18 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20))))) {
        local_168.fractionality = local_128._M_current[1].row_ep_norm2;
        local_168.row_ep_norm2._0_4_ = SUB84(local_128._M_current[1].score,0);
        local_168.row_ep_norm2._4_4_ = (undefined4)((ulong)local_128._M_current[1].score >> 0x20);
        local_d8 = (FractionalInteger *)
                   local_128._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppStack_d0 = local_128._M_current[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_c0 = (FractionalInteger *)
                   local_128._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_128._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar20 = (long)local_130._M_current;
        local_128._M_current = _Var29._M_current;
        while( true ) {
          puVar3 = (undefined8 *)((long)&((FractionalInteger *)this)->fractionality + lVar20);
          uVar4 = *puVar3;
          uVar9 = puVar3[1];
          puVar3 = (undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + lVar20 + 4);
          uVar10 = puVar3[1];
          puVar1 = (undefined8 *)
                   ((long)&(((FractionalInteger *)this)->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar20);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)
                   ((long)&((FractionalInteger *)((long)this + 0x38))->row_ep_norm2 + lVar20 + 4);
          *puVar1 = *puVar3;
          puVar1[1] = uVar10;
          puVar3 = (undefined8 *)
                   ((long)&((FractionalInteger *)((long)this + 0x38))->fractionality + lVar20);
          *puVar3 = uVar4;
          puVar3[1] = uVar9;
          pvVar7 = *(void **)((long)&(((FractionalInteger *)((long)this + 0x38))->row_ep).
                                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar20);
          puVar3 = (undefined8 *)
                   ((long)&(((FractionalInteger *)((long)this + 0x38))->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar20);
          *puVar3 = uVar11;
          puVar3[1] = uVar12;
          *(undefined8 *)
           ((long)&(((FractionalInteger *)((long)this + 0x38))->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar20) =
               *(undefined8 *)
                ((long)&(((FractionalInteger *)this)->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar20);
          puVar3 = (undefined8 *)
                   ((long)&(((FractionalInteger *)this)->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar20);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined8 *)
           ((long)&(((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar20) = 0;
          if (pvVar7 != (void *)0x0) {
            operator_delete(pvVar7);
          }
          pFVar25 = (FractionalInteger *)this;
          if (lVar20 == 0) goto LAB_002e7c3d;
          dVar46 = *(double *)
                    ((long)&((FractionalInteger *)((long)this + -0x38))->fractionality + lVar20);
          lVar17 = (long)*(int *)((long)this + lVar20 + -0x20);
          auVar37._0_8_ = (1.0 - dVar46) * dVar46;
          auVar37._8_8_ = local_118._8_8_;
          auVar42._8_8_ = *(undefined8 *)((long)(end._M_current)->fractionality + lVar22 * 8);
          auVar42._0_8_ = *(undefined8 *)((long)(end._M_current)->fractionality + lVar17 * 8);
          auVar36 = divpd(auVar37,auVar42);
          if ((auVar36._8_8_ <= auVar36._0_8_) &&
             ((auVar36._8_8_ < auVar36._0_8_ ||
              (uVar27 = lVar17 + (comp_00.edgeWt)->numTries, uVar23 = uVar27 >> 0x20,
              uVar27 = uVar27 & 0xffffffff, uVar18 = (comp_00.edgeWt)->numTries + lVar22,
              uVar24 = uVar18 & 0xffffffff, uVar18 = uVar18 >> 0x20,
              ((uVar24 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
              (uVar18 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20) <=
              ((uVar27 + 0x42d8680e260ae5b) * (uVar23 + 0x8a183895eeac1536) ^
              (uVar23 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20))))) break;
          lVar20 = lVar20 + -0x38;
        }
        pFVar25 = (FractionalInteger *)((long)&((FractionalInteger *)this)->fractionality + lVar20);
LAB_002e7c3d:
        pFVar25->fractionality = (double)local_f8;
        pdVar2 = (double *)((long)&((FractionalInteger *)this)->row_ep_norm2 + lVar20);
        *pdVar2 = local_168.fractionality;
        pdVar2[1] = (double)CONCAT44(local_168.row_ep_norm2._4_4_,local_168.row_ep_norm2._0_4_);
        *(undefined4 *)((long)&((FractionalInteger *)this)->basisIndex + lVar20) = local_b8._0_4_;
        pvVar7 = *(void **)((long)&(((FractionalInteger *)this)->row_ep).
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar20);
        puVar3 = (undefined8 *)
                 ((long)&(((FractionalInteger *)this)->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar20);
        *puVar3 = local_d8;
        puVar3[1] = ppStack_d0;
        *(FractionalInteger **)
         ((long)&(((FractionalInteger *)this)->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar20) = local_c0;
        _Var29._M_current = local_128._M_current;
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7);
          _Var29._M_current = local_128._M_current;
        }
      }
      local_128._M_current = _Var29._M_current;
      _Var29._M_current = local_128._M_current + 1;
      local_130._M_current = local_130._M_current + 0x38;
    } while (_Var29._M_current != begin._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }